

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O1

void Imf_3_4::RgbaYca::roundYCA(int n,uint roundY,uint roundC,Rgba *ycaIn,Rgba *ycaOut)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  
  if (0 < n) {
    uVar2 = 9 - roundC;
    uVar3 = 0;
    do {
      uVar4 = ycaIn[uVar3].g._h;
      if (roundY < 10) {
        bVar1 = (byte)(9 - roundY);
        uVar7 = ((uVar4 & 0x7fff) >> (bVar1 & 0x1f)) +
                (uint)(((uVar4 & 0x7fff) >> (9 - roundY & 0x1f) & 1) != 0) << (bVar1 & 0x1f);
        uVar5 = (ushort)uVar7;
        if (0x7bff < (uVar7 & 0xfc00)) {
          uVar5 = uVar4 & (ushort)(-1 << (10U - (char)roundY & 0x1f));
        }
        uVar4 = uVar4 & 0x8000 | uVar5;
      }
      ycaOut[uVar3].g._h = uVar4;
      ycaOut[uVar3].a._h = ycaIn[uVar3].a._h;
      if ((uVar3 & 1) == 0) {
        uVar4 = ycaIn[uVar3].r._h;
        bVar1 = (byte)uVar2;
        uVar5 = (ushort)(-1 << (10U - (char)roundC & 0x1f));
        if (roundC < 10) {
          uVar7 = ((uVar4 & 0x7fff) >> (bVar1 & 0x1f)) +
                  (uint)(((uVar4 & 0x7fff) >> (uVar2 & 0x1f) & 1) != 0) << (bVar1 & 0x1f);
          uVar6 = (ushort)uVar7;
          if (0x7bff < (uVar7 & 0xfc00)) {
            uVar6 = uVar4 & uVar5;
          }
          uVar4 = uVar4 & 0x8000 | uVar6;
        }
        ycaOut[uVar3].r._h = uVar4;
        uVar4 = ycaIn[uVar3].b._h;
        if (roundC < 10) {
          uVar7 = ((uVar4 & 0x7fff) >> (bVar1 & 0x1f)) +
                  (uint)(((uVar4 & 0x7fff) >> (uVar2 & 0x1f) & 1) != 0) << (bVar1 & 0x1f);
          uVar6 = (ushort)uVar7;
          if (0x7bff < (uVar7 & 0xfc00)) {
            uVar6 = uVar4 & uVar5;
          }
          uVar4 = uVar4 & 0x8000 | uVar6;
        }
        ycaOut[uVar3].b._h = uVar4;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
  }
  return;
}

Assistant:

void
roundYCA (
    int          n,
    unsigned int roundY,
    unsigned int roundC,
    const Rgba   ycaIn[/*n*/],
    Rgba         ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
        ycaOut[i].g = ycaIn[i].g.round (roundY);
        ycaOut[i].a = ycaIn[i].a;

        if ((i & 1) == 0)
        {
            ycaOut[i].r = ycaIn[i].r.round (roundC);
            ycaOut[i].b = ycaIn[i].b.round (roundC);
        }
    }
}